

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  int iVar1;
  bool bVar2;
  PCRE re;
  LogMessageFatal local_1b0;
  
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  do {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      return;
    }
    PCRE::PCRE(&re,regexp,EnabledCompileOptions);
    bVar2 = std::operator==(re.error_,"");
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x3ab);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if (anchor == kAnchored) {
      bVar2 = PCRE::FullMatchFunctor::operator()
                        ((FullMatchFunctor *)&PCRE::FullMatch,text,&re,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args);
      if (bVar2 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3ad);
        std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                        "Check failed: (PCRE::FullMatch(text, re)) == (expect_match)");
LAB_00126bab:
        LogMessageFatal::~LogMessageFatal(&local_1b0);
      }
    }
    else {
      bVar2 = PCRE::PartialMatchFunctor::operator()
                        ((PartialMatchFunctor *)&PCRE::PartialMatch,text,&re,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
      if (bVar2 != expect_match) {
        LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3af);
        std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                        "Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)");
        goto LAB_00126bab;
      }
    }
    PCRE::~PCRE(&re);
  } while( true );
}

Assistant:

void SearchPCRE(int iters, const char* regexp, const StringPiece& text,
                Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    PCRE re(regexp, PCRE::UTF8);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}